

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O2

void updtMem(FOCC_OTA *foccOta,int mTid)

{
  long *plVar1;
  ulong uVar2;
  FILE *__stream;
  uint uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  tm *ptVar7;
  pthread_t pVar8;
  uint uVar9;
  result_type_conflict rVar10;
  int locVal;
  uint local_8c;
  time_t exitTime;
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  long local_70;
  long local_68;
  time_t enterTime;
  char buf [40];
  
  local_70 = (long)mTid;
  for (local_80 = 0; local_80 < glb::numTrans; local_80 = local_80 + 1) {
    uVar9 = 0;
    local_68 = std::chrono::_V2::system_clock::now();
    do {
      local_7c = uVar9;
      local_8c = FOCC_OTA::begin_trans(glb::foccOta);
      local_78 = rand();
      local_78 = local_78 % glb::M;
      iVar5 = 0;
      while (uVar9 = local_8c, iVar5 <= local_78) {
        local_74 = iVar5;
        iVar5 = rand();
        uVar2 = (long)iVar5 % (long)glb::M;
        iVar5 = rand();
        uVar9 = local_8c;
        iVar5 = iVar5 % glb::constVal;
        FOCC_OTA::read(glb::foccOta,local_8c,(void *)(uVar2 & 0xffffffff),(size_t)&locVal);
        lVar6 = std::chrono::_V2::system_clock::now();
        exitTime = lVar6 / 1000000000;
        ptVar7 = localtime(&exitTime);
        strftime(buf,0x28,"%H:%M:%S",ptVar7);
        __stream = glb::log_file;
        pVar8 = pthread_self();
        fprintf(__stream,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",pVar8,
                (ulong)uVar9,uVar2 & 0xffffffff,(ulong)(uint)locVal,buf);
        locVal = iVar5 + locVal;
        FOCC_OTA::write(glb::foccOta,uVar9,(void *)(uVar2 & 0xffffffff),(ulong)(uint)locVal);
        lVar6 = std::chrono::_V2::system_clock::now();
        enterTime = lVar6 / 1000000000;
        ptVar7 = localtime(&enterTime);
        strftime(buf,0x28,"%H:%M:%S",ptVar7);
        fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",
                pVar8,(ulong)uVar9,uVar2 & 0xffffffff,(ulong)(uint)locVal,buf);
        rVar10 = std::exponential_distribution<double>::operator()
                           ((exponential_distribution<double> *)&glb::dist,
                            (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *
                            )&glb::generator);
        usleep((__useconds_t)(long)(rVar10 * 1000.0));
        iVar5 = local_74 + 1;
      }
      cVar4 = FOCC_OTA::tryC(glb::foccOta,local_8c);
      lVar6 = std::chrono::_V2::system_clock::now();
      exitTime = lVar6 / 1000000000;
      ptVar7 = localtime(&exitTime);
      strftime(buf,0x28,"%H:%M:%S",ptVar7);
      fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",(ulong)uVar9,
              (ulong)(uint)(int)cVar4,buf);
      uVar3 = local_7c;
      uVar9 = (cVar4 == 'a') + local_7c;
    } while (cVar4 != 'c');
    lVar6 = std::chrono::_V2::system_clock::now();
    plVar1 = (long *)(glb::total_delay + local_70 * 8);
    *plVar1 = *plVar1 + (lVar6 - local_68) / 1000000;
    plVar1 = (long *)(glb::total_aborts + local_70 * 8);
    *plVar1 = *plVar1 + (ulong)uVar3;
  }
  return;
}

Assistant:

void updtMem(FOCC_OTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = glb::foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                glb::foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                glb::foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = glb::foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}